

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::getCursorPosition(Private *this,usize *x,usize *y)

{
  code *pcVar1;
  int iVar2;
  ssize_t sVar3;
  usize uVar4;
  int iy;
  int ix;
  char buffer [64];
  
  sVar3 = write(originalStdout,"\x1b[6n",4);
  if (sVar3 != 4) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x14f,"write(originalStdout, \"\\x1b[6n\", 4) == 4");
    if (iVar2 != 0) goto LAB_001059ff;
  }
  uVar4 = readNextUnbufferedEscapedSequence(this,buffer,'[','R');
  if (uVar4 < 2) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x151,"readNextUnbufferedEscapedSequence(buffer, \'[\', \'R\') > 1");
    if (iVar2 != 0) goto LAB_001059ff;
  }
  iVar2 = __isoc99_sscanf(buffer + 2,"%d;%d",&iy,&ix);
  if (iVar2 != 2) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x153,"sscanf(buffer + 2, \"%d;%d\", &iy, &ix) == 2");
    if (iVar2 != 0) {
LAB_001059ff:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  *x = (long)ix - 1;
  *y = (long)iy - 1;
  return;
}

Assistant:

void getCursorPosition(usize& x, usize& y)
  {
#ifdef _MSC_VER
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    VERIFY(GetConsoleScreenBufferInfo(hOriginalStdOut, &csbi));
    x = csbi.dwCursorPosition.X;
    y = csbi.dwCursorPosition.Y;
#else
    VERIFY(write(originalStdout, "\x1b[6n", 4) == 4);
    char buffer[64];
    VERIFY(readNextUnbufferedEscapedSequence(buffer, '[', 'R') > 1);
    int ix, iy;
    VERIFY(sscanf(buffer + 2, "%d;%d", &iy, &ix) == 2);
    x = ix - 1;
    y = iy - 1;
#endif
  }